

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# correctness.cc
# Opt level: O2

void __thiscall CorrectnessTest::regular_test(CorrectnessTest *this,uint64_t max)

{
  CorrectnessTest *this_00;
  ulong uVar1;
  char cVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  bool bVar5;
  allocator local_b1;
  KVStore *local_b0;
  string local_a8;
  allocator local_81;
  string local_80;
  uint64_t local_60;
  CorrectnessTest *local_58;
  string local_50;
  
  local_b0 = &(this->super_Test).store;
  local_60 = max;
  KVStore::get_abi_cxx11_(&local_a8,local_b0,1);
  std::__cxx11::string::string
            ((string *)&local_80,
             "/workspace/llm4binary/github/license_all_cmakelists_25/markcty[P]LSM-KV/correctness.cc"
             ,(allocator *)&local_50);
  Test::expect<std::__cxx11::string>
            (&this->super_Test,&Test::not_found_abi_cxx11_,&local_a8,&local_80,0x10);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::string((string *)&local_a8,"SE",(allocator *)&local_80);
  KVStore::put(local_b0,1,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::string((string *)&local_a8,"SE",&local_b1);
  KVStore::get_abi_cxx11_(&local_80,local_b0,1);
  std::__cxx11::string::string
            ((string *)&local_50,
             "/workspace/llm4binary/github/license_all_cmakelists_25/markcty[P]LSM-KV/correctness.cc"
             ,&local_81);
  Test::expect<std::__cxx11::string>(&this->super_Test,&local_a8,&local_80,&local_50,0x12);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a8);
  local_80._M_dataplus._M_p._0_1_ = 1;
  local_50._M_dataplus._M_p._0_1_ = KVStore::del(local_b0,1);
  std::__cxx11::string::string
            ((string *)&local_a8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/markcty[P]LSM-KV/correctness.cc"
             ,&local_b1);
  Test::expect<bool>(&this->super_Test,(bool *)&local_80,(bool *)&local_50,&local_a8,0x13);
  std::__cxx11::string::~string((string *)&local_a8);
  KVStore::get_abi_cxx11_(&local_a8,local_b0,1);
  std::__cxx11::string::string
            ((string *)&local_80,
             "/workspace/llm4binary/github/license_all_cmakelists_25/markcty[P]LSM-KV/correctness.cc"
             ,(allocator *)&local_50);
  Test::expect<std::__cxx11::string>
            (&this->super_Test,&Test::not_found_abi_cxx11_,&local_a8,&local_80,0x14);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a8);
  local_80._M_dataplus._M_p._0_1_ = 0;
  local_50._M_dataplus._M_p._0_1_ = KVStore::del(local_b0,1);
  std::__cxx11::string::string
            ((string *)&local_a8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/markcty[P]LSM-KV/correctness.cc"
             ,&local_b1);
  Test::expect<bool>(&this->super_Test,(bool *)&local_80,(bool *)&local_50,&local_a8,0x15);
  std::__cxx11::string::~string((string *)&local_a8);
  local_58 = this;
  Test::phase(&this->super_Test);
  uVar3 = local_60;
  uVar4 = 0;
  while (bVar5 = uVar3 != 0, uVar3 = uVar3 - 1, bVar5) {
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    cVar2 = (char)(uVar4 + 1);
    std::__cxx11::string::_M_construct((ulong)&local_a8,cVar2);
    KVStore::put(local_b0,uVar4,&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_a8,cVar2);
    KVStore::get_abi_cxx11_(&local_80,local_b0,uVar4);
    std::__cxx11::string::string
              ((string *)&local_50,
               "/workspace/llm4binary/github/license_all_cmakelists_25/markcty[P]LSM-KV/correctness.cc"
               ,&local_b1);
    Test::expect<std::__cxx11::string>(&local_58->super_Test,&local_a8,&local_80,&local_50,0x1c);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_a8);
    uVar4 = uVar4 + 1;
  }
  Test::phase(&local_58->super_Test);
  uVar3 = local_60;
  uVar4 = 0;
  while (this_00 = local_58, bVar5 = uVar3 != 0, uVar3 = uVar3 - 1, bVar5) {
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_a8,(char)(uVar4 + 1));
    KVStore::get_abi_cxx11_(&local_80,local_b0,uVar4);
    std::__cxx11::string::string
              ((string *)&local_50,
               "/workspace/llm4binary/github/license_all_cmakelists_25/markcty[P]LSM-KV/correctness.cc"
               ,&local_b1);
    Test::expect<std::__cxx11::string>(&local_58->super_Test,&local_a8,&local_80,&local_50,0x22);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_a8);
    uVar4 = uVar4 + 1;
  }
  Test::phase(&local_58->super_Test);
  for (uVar1 = 0; uVar1 < local_60; uVar1 = uVar1 + 2) {
    local_80._M_dataplus._M_p._0_1_ = 1;
    local_50._M_dataplus._M_p._0_1_ = KVStore::del(local_b0,uVar1);
    std::__cxx11::string::string
              ((string *)&local_a8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/markcty[P]LSM-KV/correctness.cc"
               ,&local_b1);
    Test::expect<bool>(&this_00->super_Test,(bool *)&local_80,(bool *)&local_50,&local_a8,0x27);
    std::__cxx11::string::~string((string *)&local_a8);
  }
  for (uVar1 = 0; local_60 != uVar1; uVar1 = uVar1 + 1) {
    if ((uVar1 & 1) == 0) {
      std::__cxx11::string::string((string *)&local_a8,(string *)&Test::not_found_abi_cxx11_);
    }
    else {
      local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
      std::__cxx11::string::_M_construct((ulong)&local_a8,(char)uVar1 + '\x01');
    }
    KVStore::get_abi_cxx11_(&local_80,local_b0,uVar1);
    std::__cxx11::string::string
              ((string *)&local_50,
               "/workspace/llm4binary/github/license_all_cmakelists_25/markcty[P]LSM-KV/correctness.cc"
               ,&local_b1);
    Test::expect<std::__cxx11::string>(&this_00->super_Test,&local_a8,&local_80,&local_50,0x2a);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_a8);
  }
  for (uVar1 = 1; uVar1 < local_60; uVar1 = uVar1 + 1) {
    local_80._M_dataplus._M_p._0_1_ = (byte)uVar1 & 1;
    local_50._M_dataplus._M_p._0_1_ = KVStore::del(local_b0,uVar1);
    std::__cxx11::string::string
              ((string *)&local_a8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/markcty[P]LSM-KV/correctness.cc"
               ,&local_b1);
    Test::expect<bool>(&this_00->super_Test,(bool *)&local_80,(bool *)&local_50,&local_a8,0x2c);
    std::__cxx11::string::~string((string *)&local_a8);
  }
  Test::phase(&this_00->super_Test);
  Test::report(&this_00->super_Test);
  return;
}

Assistant:

void regular_test(uint64_t max) {
    uint64_t i;

    // Test a single key
    EXPECT(not_found, store.get(1));
    store.put(1, "SE");
    EXPECT("SE", store.get(1));
    EXPECT(true, store.del(1));
    EXPECT(not_found, store.get(1));
    EXPECT(false, store.del(1));

    phase();

    // Test multiple key-value pairs
    for (i = 0; i < max; ++i) {
      store.put(i, std::string(i + 1, 's'));
      EXPECT(std::string(i + 1, 's'), store.get(i));
    }
    phase();

    // Test after all insertions
    for (i = 0; i < max; ++i) {
      EXPECT(std::string(i + 1, 's'), store.get(i));
    }
    phase();

    // Test deletions
    for (i = 0; i < max; i += 2) EXPECT(true, store.del(i));

    for (i = 0; i < max; ++i)
      EXPECT((i & 1) ? std::string(i + 1, 's') : not_found, store.get(i));

    for (i = 1; i < max; ++i) EXPECT(i & 1, store.del(i));

    phase();

    report();
  }